

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual_mips.h
# Opt level: O0

shared_ptr<vmips::VirtReg> __thiscall
vmips::CFGNode::append<vmips::addi,std::shared_ptr<vmips::VirtReg>&,int>
          (CFGNode *this,shared_ptr<vmips::VirtReg> *args,int *args_1)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  shared_ptr<vmips::VirtReg> sVar2;
  shared_ptr<vmips::Instruction> local_60 [2];
  undefined1 local_40 [8];
  shared_ptr<vmips::addi> instr;
  int *args_local_1;
  shared_ptr<vmips::VirtReg> *args_local;
  CFGNode *this_local;
  shared_ptr<vmips::VirtReg> *ret;
  
  instr.super___shared_ptr<vmips::addi,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._7_1_ = 0;
  vmips::VirtReg::create();
  std::
  make_shared<vmips::addi,std::shared_ptr<vmips::VirtReg>&,std::shared_ptr<vmips::VirtReg>&,int>
            ((shared_ptr<vmips::VirtReg> *)local_40,(shared_ptr<vmips::VirtReg> *)this,args_1);
  std::shared_ptr<vmips::Instruction>::shared_ptr<vmips::addi,void>
            (local_60,(shared_ptr<vmips::addi> *)local_40);
  std::
  vector<std::shared_ptr<vmips::Instruction>,_std::allocator<std::shared_ptr<vmips::Instruction>_>_>
  ::push_back((vector<std::shared_ptr<vmips::Instruction>,_std::allocator<std::shared_ptr<vmips::Instruction>_>_>
               *)(args + 3),local_60);
  std::shared_ptr<vmips::Instruction>::~shared_ptr(local_60);
  instr.super___shared_ptr<vmips::addi,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._7_1_ = 1;
  std::shared_ptr<vmips::addi>::~shared_ptr((shared_ptr<vmips::addi> *)local_40);
  _Var1._M_pi = extraout_RDX;
  if ((instr.super___shared_ptr<vmips::addi,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._7_1_ & 1
      ) == 0) {
    std::shared_ptr<vmips::VirtReg>::~shared_ptr((shared_ptr<vmips::VirtReg> *)this);
    _Var1._M_pi = extraout_RDX_00;
  }
  sVar2.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var1._M_pi;
  sVar2.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this
  ;
  return (shared_ptr<vmips::VirtReg>)
         sVar2.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<VirtReg> append(Args &&...args) {
            auto ret = VirtReg::create();
            auto instr = std::make_shared<Instr>(ret, std::forward<Args>(args)...);
            instructions.push_back(instr);
            return ret;
        }